

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_im2col_gemm.h
# Opt level: O0

void ncnn::convolution_im2col_input_tile
               (Mat *bottom_blob,Mat *B,int j,int max_jj,int k,int max_kk,int kernel_w,int kernel_h,
               int dilation_w,int dilation_h,int stride_w,int stride_h)

{
  int in_ECX;
  int in_EDX;
  Mat *in_RSI;
  Mat *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  int in_stack_00000028;
  int in_stack_00000f38;
  int in_stack_00000f3c;
  int in_stack_00000f40;
  int in_stack_00000f44;
  Mat *in_stack_00000f48;
  Mat *in_stack_00000f50;
  int in_stack_00002650;
  int in_stack_00002654;
  int in_stack_00002658;
  int in_stack_0000265c;
  Mat *in_stack_00002660;
  Mat *in_stack_00002668;
  
  if ((((in_stack_00000008 == 1) && (in_stack_00000010 == 1)) && (in_stack_00000018 == 1)) &&
     (((in_stack_00000020 == 1 && (in_stack_00000028 == 1)) && (max_kk == 1)))) {
    convolution_im2col_input_tile_conv1x1s1d1
              (in_stack_00000f50,in_stack_00000f48,in_stack_00000f44,in_stack_00000f40,
               in_stack_00000f3c,in_stack_00000f38);
  }
  else if (((in_stack_00000008 == 1) && (in_stack_00000010 == 1)) &&
          ((in_stack_00000028 == 2 && (max_kk == 2)))) {
    convolution_im2col_input_tile_avx<1,1,1,1,2,2>(in_RDI,in_RSI,in_EDX,in_ECX,in_R8D,in_R9D);
  }
  else if (((((in_stack_00000008 == 3) && (in_stack_00000010 == 3)) && (in_stack_00000018 == 1)) &&
           ((in_stack_00000020 == 1 && (in_stack_00000028 == 1)))) && (max_kk == 1)) {
    convolution_im2col_input_tile_avx<3,3,1,1,1,1>(in_RDI,in_RSI,in_EDX,in_ECX,in_R8D,in_R9D);
  }
  else if (((in_stack_00000008 == 3) && (in_stack_00000010 == 3)) &&
          ((in_stack_00000018 == 1 &&
           (((in_stack_00000020 == 1 && (in_stack_00000028 == 2)) && (max_kk == 2)))))) {
    convolution_im2col_input_tile_avx<3,3,1,1,2,2>(in_RDI,in_RSI,in_EDX,in_ECX,in_R8D,in_R9D);
  }
  else if (((in_stack_00000008 == 5) && (in_stack_00000010 == 5)) &&
          ((in_stack_00000018 == 1 &&
           (((in_stack_00000020 == 1 && (in_stack_00000028 == 1)) && (max_kk == 1)))))) {
    convolution_im2col_input_tile_avx<5,5,1,1,1,1>(in_RDI,in_RSI,in_EDX,in_ECX,in_R8D,in_R9D);
  }
  else if (((((in_stack_00000008 == 5) && (in_stack_00000010 == 5)) && (in_stack_00000018 == 1)) &&
           ((in_stack_00000020 == 1 && (in_stack_00000028 == 2)))) && (max_kk == 2)) {
    convolution_im2col_input_tile_avx<5,5,1,1,2,2>(in_RDI,in_RSI,in_EDX,in_ECX,in_R8D,in_R9D);
  }
  else if (((in_stack_00000008 == 7) && (in_stack_00000010 == 7)) &&
          ((in_stack_00000018 == 1 &&
           (((in_stack_00000020 == 1 && (in_stack_00000028 == 2)) && (max_kk == 2)))))) {
    convolution_im2col_input_tile_avx<7,7,1,1,2,2>(in_RDI,in_RSI,in_EDX,in_ECX,in_R8D,in_R9D);
  }
  else {
    convolution_im2col_input_tile_impl
              (in_stack_00002668,in_stack_00002660,in_stack_0000265c,in_stack_00002658,
               in_stack_00002654,in_stack_00002650,in_stack_00000010,in_stack_00000018,
               in_stack_00000020,in_stack_00000028,max_kk,in_R9D);
  }
  return;
}

Assistant:

static void convolution_im2col_input_tile(const Mat& bottom_blob, Mat& B, int j, int max_jj, int k, int max_kk, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h)
{
    if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        convolution_im2col_input_tile_conv1x1s1d1(bottom_blob, B, j, max_jj, k, max_kk);
        return;
    }

    if (kernel_w == 1 && kernel_h == 1 && stride_w == 2 && stride_h == 2)
    {
#if __AVX512F__
        convolution_im2col_input_tile_avx512<1, 1, 1, 1, 2, 2>(bottom_blob, B, j, max_jj, k, max_kk);
#elif __AVX__
        convolution_im2col_input_tile_avx<1, 1, 1, 1, 2, 2>(bottom_blob, B, j, max_jj, k, max_kk);
#else
        convolution_im2col_input_tile<1, 1, 1, 1, 2, 2>(bottom_blob, B, j, max_jj, k, max_kk);
#endif
        return;
    }

    if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
#if __AVX512F__
        convolution_im2col_input_tile_avx512<3, 3, 1, 1, 1, 1>(bottom_blob, B, j, max_jj, k, max_kk);
#elif __AVX__
        convolution_im2col_input_tile_avx<3, 3, 1, 1, 1, 1>(bottom_blob, B, j, max_jj, k, max_kk);
#else
        convolution_im2col_input_tile<3, 3, 1, 1, 1, 1>(bottom_blob, B, j, max_jj, k, max_kk);
#endif
        return;
    }

    if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
    {
#if __AVX512F__
        convolution_im2col_input_tile_avx512<3, 3, 1, 1, 2, 2>(bottom_blob, B, j, max_jj, k, max_kk);
#elif __AVX__
        convolution_im2col_input_tile_avx<3, 3, 1, 1, 2, 2>(bottom_blob, B, j, max_jj, k, max_kk);
#else
        convolution_im2col_input_tile<3, 3, 1, 1, 2, 2>(bottom_blob, B, j, max_jj, k, max_kk);
#endif
        return;
    }

    if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
#if __AVX512F__
        convolution_im2col_input_tile_avx512<5, 5, 1, 1, 1, 1>(bottom_blob, B, j, max_jj, k, max_kk);
#elif __AVX__
        convolution_im2col_input_tile_avx<5, 5, 1, 1, 1, 1>(bottom_blob, B, j, max_jj, k, max_kk);
#else
        convolution_im2col_input_tile<5, 5, 1, 1, 1, 1>(bottom_blob, B, j, max_jj, k, max_kk);
#endif
        return;
    }

    if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
    {
#if __AVX512F__
        convolution_im2col_input_tile_avx512<5, 5, 1, 1, 2, 2>(bottom_blob, B, j, max_jj, k, max_kk);
#elif __AVX__
        convolution_im2col_input_tile_avx<5, 5, 1, 1, 2, 2>(bottom_blob, B, j, max_jj, k, max_kk);
#else
        convolution_im2col_input_tile<5, 5, 1, 1, 2, 2>(bottom_blob, B, j, max_jj, k, max_kk);
#endif
        return;
    }

    if (kernel_w == 7 && kernel_h == 7 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
    {
#if __AVX512F__
        convolution_im2col_input_tile_avx512<7, 7, 1, 1, 2, 2>(bottom_blob, B, j, max_jj, k, max_kk);
#elif __AVX__
        convolution_im2col_input_tile_avx<7, 7, 1, 1, 2, 2>(bottom_blob, B, j, max_jj, k, max_kk);
#else
        convolution_im2col_input_tile<7, 7, 1, 1, 2, 2>(bottom_blob, B, j, max_jj, k, max_kk);
#endif
        return;
    }

    convolution_im2col_input_tile_impl(bottom_blob, B, j, max_jj, k, max_kk, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h);
}